

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  DataDictionary *this;
  allocator<char> local_49;
  string local_48 [36];
  int local_24;
  short local_1e;
  int opt;
  short port;
  char **ppcStack_18;
  int count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  opt = 0;
  local_1e = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    while( true ) {
      local_24 = getopt((int)argv_local,ppcStack_18,"+p:+c:");
      if (local_24 == -1) {
        this = (DataDictionary *)operator_new(1000);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_48,"../spec/FIX42.xml",&local_49);
        FIX::DataDictionary::DataDictionary(this,local_48,false);
        std::unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>::reset
                  (&s_dataDictionary,this);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator(&local_49);
        std::operator<<((ostream *)&std::cout,"Converting integers to strings: ");
        lVar1 = testIntegerToString(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Converting strings to integers: ");
        lVar1 = testStringToInteger(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Converting doubles to strings: ");
        lVar1 = testDoubleToString(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Converting strings to doubles: ");
        lVar1 = testStringToDouble(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Creating Heartbeat messages: ");
        lVar1 = testCreateHeartbeat(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Identifying message types: ");
        lVar1 = testIdentifyType(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Serializing Heartbeat messages to strings: ");
        lVar1 = testSerializeToStringHeartbeat(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Serializing Heartbeat messages from strings: ");
        lVar1 = testSerializeFromStringHeartbeat(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Serializing Heartbeat messages from strings and validation: ");
        lVar1 = testSerializeFromStringAndValidateHeartbeat(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Creating NewOrderSingle messages: ");
        lVar1 = testCreateNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Serializing NewOrderSingle messages to strings: ");
        lVar1 = testSerializeToStringNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Serializing NewOrderSingle messages from strings: ");
        lVar1 = testSerializeFromStringNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Serializing NewOrderSingle messages from strings and validation: ");
        lVar1 = testSerializeFromStringAndValidateNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Creating QuoteRequest messages: ");
        lVar1 = testCreateQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Serializing QuoteRequest messages to strings: ");
        lVar1 = testSerializeToStringQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Serializing QuoteRequest messages from strings: ");
        lVar1 = testSerializeFromStringQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Serializing QuoteRequest messages from strings and validation: ");
        lVar1 = testSerializeFromStringAndValidateQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Reading fields from QuoteRequest message: ");
        lVar1 = testReadFromQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,"Storing NewOrderSingle messages: ");
        lVar1 = testFileStoreNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Validating NewOrderSingle messages with no data dictionary: ");
        lVar1 = testValidateNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Validating NewOrderSingle messages with data dictionary: ");
        lVar1 = testValidateDictNewOrderSingle(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Validating QuoteRequest messages with no data dictionary: ");
        lVar1 = testValidateQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Validating QuoteRequest messages with data dictionary: ");
        lVar1 = testValidateDictQuoteRequest(opt);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Sending/Receiving NewOrderSingle/ExecutionReports on Socket");
        lVar1 = testSendOnSocket(opt,local_1e);
        report(lVar1,opt);
        std::operator<<((ostream *)&std::cout,
                        "Sending/Receiving NewOrderSingle/ExecutionReports on ThreadedSocket");
        lVar1 = testSendOnThreadedSocket(opt,local_1e);
        report(lVar1,opt);
        return 0;
      }
      if (local_24 != 99) break;
      opt = atoi(optarg);
    }
    if (local_24 != 0x70) break;
    lVar1 = atol(optarg);
    local_1e = (short)lVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
  poVar2 = std::operator<<(poVar2,*ppcStack_18);
  poVar2 = std::operator<<(poVar2," -p port -c count");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int main( int argc, char** argv )
{
  int count = 0;
  short port = 0;

  int opt;
  while ( (opt = getopt( argc, argv, "+p:+c:" )) != -1 )
  {
    switch( opt )
    {
    case 'p':
      port = (short)atol( optarg );
      break;
    case 'c':
      count = atoi( optarg );
      break;
    default:
      std::cout << "usage: "
      << argv[ 0 ]
      << " -p port -c count" << std::endl;
      return 1;
    }
  }

  s_dataDictionary.reset( new FIX::DataDictionary( "../spec/FIX42.xml" ) );

  std::cout << "Converting integers to strings: ";
  report( testIntegerToString( count ), count );

  std::cout << "Converting strings to integers: ";
  report( testStringToInteger( count ), count );

  std::cout << "Converting doubles to strings: ";
  report( testDoubleToString( count ), count );

  std::cout << "Converting strings to doubles: ";
  report( testStringToDouble( count ), count );

  std::cout << "Creating Heartbeat messages: ";
  report( testCreateHeartbeat( count ), count );

  std::cout << "Identifying message types: ";
  report( testIdentifyType( count ), count );

  std::cout << "Serializing Heartbeat messages to strings: ";
  report( testSerializeToStringHeartbeat( count ), count );

  std::cout << "Serializing Heartbeat messages from strings: ";
  report( testSerializeFromStringHeartbeat( count ), count );

  std::cout << "Serializing Heartbeat messages from strings and validation: ";
  report( testSerializeFromStringAndValidateHeartbeat( count ), count );

  std::cout << "Creating NewOrderSingle messages: ";
  report( testCreateNewOrderSingle( count ), count );

  std::cout << "Serializing NewOrderSingle messages to strings: ";
  report( testSerializeToStringNewOrderSingle( count ), count );

  std::cout << "Serializing NewOrderSingle messages from strings: ";
  report( testSerializeFromStringNewOrderSingle( count ), count );

  std::cout << "Serializing NewOrderSingle messages from strings and validation: ";
  report( testSerializeFromStringAndValidateNewOrderSingle( count ), count );

  std::cout << "Creating QuoteRequest messages: ";
  report( testCreateQuoteRequest( count ), count );

  std::cout << "Serializing QuoteRequest messages to strings: ";
  report( testSerializeToStringQuoteRequest( count ), count );

  std::cout << "Serializing QuoteRequest messages from strings: ";
  report( testSerializeFromStringQuoteRequest( count ), count );

  std::cout << "Serializing QuoteRequest messages from strings and validation: ";
  report( testSerializeFromStringAndValidateQuoteRequest( count ), count );

  std::cout << "Reading fields from QuoteRequest message: ";
  report( testReadFromQuoteRequest( count ), count );

  std::cout << "Storing NewOrderSingle messages: ";
  report( testFileStoreNewOrderSingle( count ), count );

  std::cout << "Validating NewOrderSingle messages with no data dictionary: ";
  report( testValidateNewOrderSingle( count ), count );

  std::cout << "Validating NewOrderSingle messages with data dictionary: ";
  report( testValidateDictNewOrderSingle( count ), count );

  std::cout << "Validating QuoteRequest messages with no data dictionary: ";
  report( testValidateQuoteRequest( count ), count );

  std::cout << "Validating QuoteRequest messages with data dictionary: ";
  report( testValidateDictQuoteRequest( count ), count );

  std::cout << "Sending/Receiving NewOrderSingle/ExecutionReports on Socket";
  report( testSendOnSocket( count, port ), count );

  std::cout << "Sending/Receiving NewOrderSingle/ExecutionReports on ThreadedSocket";
  report( testSendOnThreadedSocket( count, port ), count );

  return 0;
}